

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O2

QSize __thiscall QMdiSubWindow::minimumSizeHint(QMdiSubWindow *this)

{
  QMdiSubWindowPrivate *this_00;
  long lVar1;
  QWidgetData *pQVar2;
  QObject *pQVar3;
  uint uVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  QMdiSubWindowPrivate *pQVar8;
  QLayout *pQVar9;
  ulong uVar10;
  QStyle *pQVar11;
  uint uVar12;
  QSize QVar13;
  uint uVar14;
  long in_FS_OFFSET;
  int minWidth;
  int margin;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QMdiSubWindowPrivate **)&(this->super_QWidget).field_0x8;
  pQVar8 = this_00;
  if ((((this->super_QWidget).data)->widget_attributes & 0x8000) != 0) {
    QWidget::ensurePolished(&this->super_QWidget);
    pQVar8 = *(QMdiSubWindowPrivate **)&(this->super_QWidget).field_0x8;
  }
  if (*(long *)&(pQVar8->super_QWidgetPrivate).field_0x10 != 0) {
    bVar5 = QWidget::isMinimized(&this->super_QWidget);
    if ((bVar5) && (*(char *)(*(long *)&(this->super_QWidget).field_0x8 + 0x2d4) == '\0')) {
      QVar13 = QMdiSubWindowPrivate::iconSize(this_00);
      uVar10 = (ulong)QVar13 >> 0x20;
      goto LAB_0041cd55;
    }
  }
  margin = -0x55555556;
  minWidth = -0x55555556;
  QMdiSubWindowPrivate::sizeParameters(this_00,&margin,&minWidth);
  iVar7 = margin;
  iVar6 = QMdiSubWindowPrivate::titleBarHeight(this_00);
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  if ((*(long *)(lVar1 + 0x10) != 0) && (*(char *)(lVar1 + 0x2d4) == '\x01')) {
    pQVar2 = (this->super_QWidget).data;
    uVar12 = ((pQVar2->crect).x2.m_i - (pQVar2->crect).x1.m_i) + 1;
    if ((int)uVar12 < minWidth) {
      uVar12 = minWidth;
    }
    QVar13.ht.m_i = 0;
    QVar13.wd.m_i = uVar12;
    uVar12 = QMdiSubWindowPrivate::titleBarHeight(this_00);
    uVar10 = (ulong)uVar12;
    goto LAB_0041cd55;
  }
  uVar14 = iVar6 + iVar7;
  pQVar9 = QWidget::layout(&this->super_QWidget);
  uVar12 = uVar14;
  if (pQVar9 == (QLayout *)0x0) {
    bVar5 = QPointer::operator_cast_to_bool((QPointer *)&this_00->baseWidget);
    if (bVar5) {
      pQVar3 = (this_00->baseWidget).wp.value;
      if ((*(byte *)(*(long *)(pQVar3 + 0x20) + 9) & 0x80) != 0) {
        uVar10 = (**(code **)(*(long *)pQVar3 + 0x78))();
        goto LAB_0041cc32;
      }
    }
  }
  else {
    pQVar9 = QWidget::layout(&this->super_QWidget);
    uVar10 = (**(code **)(*(long *)pQVar9 + 0x90))(pQVar9);
LAB_0041cc32:
    if ((uVar10 & 0x8000000080000000) == 0) {
      iVar7 = (int)uVar10 + iVar7 * 2;
      if (iVar7 < minWidth) {
        iVar7 = minWidth;
      }
      uVar12 = (int)(uVar10 >> 0x20) + uVar14;
      minWidth = iVar7;
    }
  }
  bVar5 = QPointer::operator_cast_to_bool((QPointer *)&this_00->sizeGrip);
  if (bVar5) {
    bVar5 = QWidget::isVisibleTo((QWidget *)(this_00->sizeGrip).wp.value,&this->super_QWidget);
    if (!bVar5) goto LAB_0041cce6;
    lVar1 = *(long *)((this_00->sizeGrip).wp.value + 0x20);
    iVar7 = (*(int *)(lVar1 + 0x20) - *(int *)(lVar1 + 0x18)) + 1;
  }
  else {
LAB_0041cce6:
    iVar7 = 0;
    if (*(long *)(*(long *)&(this->super_QWidget).field_0x8 + 0x10) != 0) {
      pQVar11 = QWidget::style(&this->super_QWidget);
      bVar5 = isMacStyle(pQVar11);
      if (bVar5) {
        bVar5 = QPointer::operator_cast_to_bool((QPointer *)&this_00->sizeGrip);
        if (!bVar5) {
          pQVar11 = QWidget::style(&this->super_QWidget);
          iVar7 = (**(code **)(*(long *)pQVar11 + 0xe0))(pQVar11,0x45,0,this);
        }
      }
    }
  }
  uVar4 = iVar7 + uVar14;
  if ((int)(iVar7 + uVar14) < (int)uVar12) {
    uVar4 = uVar12;
  }
  uVar10 = (ulong)uVar4;
  QVar13.ht.m_i = 0;
  QVar13.wd.m_i = minWidth;
LAB_0041cd55:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (QSize)((ulong)QVar13 & 0xffffffff | uVar10 << 0x20);
  }
  __stack_chk_fail();
}

Assistant:

QSize QMdiSubWindow::minimumSizeHint() const
{
    Q_D(const QMdiSubWindow);
    if (isVisible())
        ensurePolished();

    // Minimized window.
    if (parent() && isMinimized() && !isShaded())
        return d->iconSize();

    // Calculate window decoration.
    int margin, minWidth;
    d->sizeParameters(&margin, &minWidth);
    int decorationHeight = margin + d->titleBarHeight();
    int minHeight = decorationHeight;

    // Shaded window.
    if (parent() && isShaded())
        return QSize(qMax(minWidth, width()), d->titleBarHeight());

    // Content
    if (layout()) {
        QSize minLayoutSize = layout()->minimumSize();
        if (minLayoutSize.isValid()) {
            minWidth = qMax(minWidth, minLayoutSize.width() + 2 * margin);
            minHeight += minLayoutSize.height();
        }
    } else if (d->baseWidget && d->baseWidget->isVisible()) {
        QSize minBaseWidgetSize = d->baseWidget->minimumSizeHint();
        if (minBaseWidgetSize.isValid()) {
            minWidth = qMax(minWidth, minBaseWidgetSize.width() + 2 * margin);
            minHeight += minBaseWidgetSize.height();
        }
    }

#if QT_CONFIG(sizegrip)
    // SizeGrip
    int sizeGripHeight = 0;
    if (d->sizeGrip && d->sizeGrip->isVisibleTo(const_cast<QMdiSubWindow *>(this)))
        sizeGripHeight = d->sizeGrip->height();
    else if (parent() && isMacStyle(style()) && !d->sizeGrip)
        sizeGripHeight = style()->pixelMetric(QStyle::PM_SizeGripSize, nullptr, this);
    minHeight = qMax(minHeight, decorationHeight + sizeGripHeight);
#endif

    return QSize(minWidth, minHeight);
}